

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalman_filter.cpp
# Opt level: O2

void __thiscall KalmanFilter::UpdateEKF(KalmanFilter *this,VectorXd *z)

{
  VectorXd *this_00;
  double dVar1;
  double dVar2;
  Scalar *pSVar3;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_01;
  double dVar4;
  double dVar5;
  double *local_98;
  VectorXd y;
  VectorXd hx;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_48;
  double local_28;
  
  this_00 = &this->x_;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,0);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,0);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,1);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,1);
  dVar5 = dVar1 * *pSVar3 + dVar5 * dVar4;
  local_98 = (double *)0x0;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,0);
  if (0.001 < ABS(*pSVar3)) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,1);
    dVar4 = *pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,0);
    dVar4 = atan2(dVar4,*pSVar3);
    local_98 = (double *)(double)(float)dVar4;
  }
  dVar5 = (double)(float)dVar5;
  local_28 = 0.0;
  if (0.001 < ABS(dVar5)) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,0);
    dVar4 = *pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,2);
    dVar1 = *pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,1);
    dVar2 = *pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,3);
    local_28 = (double)(float)((dVar2 * *pSVar3 + dVar4 * dVar1) / dVar5);
  }
  hx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)Eigen::internal::aligned_malloc(0x18);
  local_48.m_xpr = &hx;
  hx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 3;
  local_48.m_row = 0;
  local_48.m_col = 1;
  local_48.m_currentBlockRows = 1;
  *hx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = dVar5;
  y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = local_98;
  this_01 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                      (&local_48,(Scalar *)&y);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(this_01,&local_28);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_48);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_48,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)z,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&hx);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((Matrix<double,_1,1,0,_1,1> *)&y,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_48);
  UpdateOps(this,&y);
  free(y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(hx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void KalmanFilter::UpdateEKF(const VectorXd &z) {
  /*
  update the state by using Extended Kalman Filter equations
  */

  // convert current state into polar coordinate
  float ro = sqrt(x_[0] * x_[0] + x_[1] * x_[1]);
  float phi = 0.0; // make phi 0.0 if too small
  if (fabs(x_[0]) > 0.001) {
    phi = atan2(x_[1], x_[0]);
  }
  float ro_dot = 0.0; // make ro_dot 0.0 if too small
  if (fabs(ro) > 0.001) {
    ro_dot = (x_[0] * x_[2] + x_[1] * x_[3]) / ro;
  }

  VectorXd hx(3);
  hx << ro, phi, ro_dot;
  
  // prediction error
  VectorXd y = z - hx;
  
  // perform rest of update
  UpdateOps(y);
}